

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_11600e9::HandleToUpperLowerCommand
          (anon_unknown_dwarf_11600e9 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool toUpper,cmExecutionStatus *status)

{
  string_view value;
  string output;
  char *local_68;
  size_t local_60;
  char local_58;
  undefined7 uStack_57;
  string local_48;
  
  if ((ulong)((long)args - (long)this) < 0x41) {
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"no output variable specified","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_68 == &local_58) goto LAB_00350f53;
  }
  else {
    local_60 = 0;
    local_58 = '\0';
    local_68 = &local_58;
    if (toUpper) {
      cmsys::SystemTools::UpperCase(&local_48,(string *)(this + 0x20));
    }
    else {
      cmsys::SystemTools::LowerCase(&local_48,(string *)(this + 0x20));
    }
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    value._M_str = local_68;
    value._M_len = local_60;
    cmMakefile::AddDefinition(status->Makefile,(string *)(this + 0x40),value);
    if (local_68 == &local_58) goto LAB_00350f53;
  }
  operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
LAB_00350f53:
  return 0x40 < (ulong)((long)args - (long)this);
}

Assistant:

bool HandleToUpperLowerCommand(std::vector<std::string> const& args,
                               bool toUpper, cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("no output variable specified");
    return false;
  }

  std::string const& outvar = args[2];
  std::string output;

  if (toUpper) {
    output = cmSystemTools::UpperCase(args[1]);
  } else {
    output = cmSystemTools::LowerCase(args[1]);
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}